

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O1

BoxList * __thiscall amrex::BoxList::convert(BoxList *this,IndexType typ)

{
  pointer pBVar1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  int dir;
  uint uVar2;
  long lVar3;
  pointer pBVar4;
  uint uVar5;
  
  __range1 = &this->m_lbox;
  (this->btype).itype = typ.itype;
  pBVar1 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar4 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar4 != pBVar1; pBVar4 = pBVar4 + 1) {
    lVar3 = 0;
    do {
      uVar5 = 1 << ((byte)lVar3 & 0x1f);
      uVar2 = (uint)lVar3;
      (pBVar4->bigend).vect[lVar3] =
           ((pBVar4->bigend).vect[lVar3] + (uint)((typ.itype >> (uVar2 & 0x1f) & 1) != 0)) -
           (uint)(((pBVar4->btype).itype >> (uVar2 & 0x1f) & 1) != 0);
      if ((typ.itype >> (uVar2 & 0x1f) & 1) == 0) {
        uVar5 = ~uVar5 & (pBVar4->btype).itype;
      }
      else {
        uVar5 = uVar5 | (pBVar4->btype).itype;
      }
      (pBVar4->btype).itype = uVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  return (BoxList *)__range1;
}

Assistant:

BoxList&
BoxList::convert (IndexType typ) noexcept
{
    btype = typ;
    for (auto& bx : m_lbox)
    {
        bx.convert(typ);
    }
    return *this;
}